

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::FamilyId,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>,_robin_hood::hash<Rml::FamilyId,_void>,_std::equal_to<Rml::FamilyId>_>
::Table(Table<true,_80UL,_Rml::FamilyId,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>,_robin_hood::hash<Rml::FamilyId,_void>,_std::equal_to<Rml::FamilyId>_>
        *this)

{
  DataNode<robin_hood::detail::Table<true,_80UL,_Rml::FamilyId,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>,_robin_hood::hash<Rml::FamilyId,_void>,_std::equal_to<Rml::FamilyId>_>,_true>
  *pDVar1;
  Table<true,_80UL,_Rml::FamilyId,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>,_robin_hood::hash<Rml::FamilyId,_void>,_std::equal_to<Rml::FamilyId>_>
  *this_local;
  
  pDVar1 = reinterpret_cast_no_cast_align_warning<robin_hood::detail::Table<true,80ul,Rml::FamilyId,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>,robin_hood::hash<Rml::FamilyId,void>,std::equal_to<Rml::FamilyId>>::DataNode<robin_hood::detail::Table<true,80ul,Rml::FamilyId,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>,robin_hood::hash<Rml::FamilyId,void>,std::equal_to<Rml::FamilyId>>,true>*>
                     (&this->mMask);
  this->mKeyVals = pDVar1;
  this->mInfo = (uint8_t *)&this->mMask;
  this->mNumElements = 0;
  this->mMask = 0;
  this->mMaxNumElementsAllowed = 0;
  this->mInfoInc = 0x20;
  this->mInfoHashShift = 0;
  return;
}

Assistant:

Table() noexcept(noexcept(Hash()) && noexcept(KeyEqual()))
        : WHash()
        , WKeyEqual() {
        ROBIN_HOOD_TRACE(this)
    }